

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
::Vector_column(Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                *this,Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                      *column,Column_settings *colSettings)

{
  pointer ppEVar1;
  Entry_constructor *pEVar2;
  Field_operators *pFVar3;
  pointer ppEVar4;
  Field_operators *pFVar5;
  bool bVar6;
  allocator_type local_39;
  value_type local_38;
  
  (this->super_Column_dimension_option).dim_ = (column->super_Column_dimension_option).dim_;
  local_38 = (value_type)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ::vector(&this->column_,
           (long)(column->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(column->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,&local_38,&local_39);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&(this->erasedValues_)._M_h,&(column->erasedValues_)._M_h);
  pFVar5 = (Field_operators *)0x0;
  bVar6 = colSettings == (Column_settings *)0x0;
  pFVar3 = column->operators_;
  if (!bVar6) {
    pFVar3 = pFVar5;
  }
  this->operators_ = pFVar3;
  pEVar2 = (Entry_constructor *)&colSettings->field_0x20;
  if (bVar6) {
    pEVar2 = column->entryPool_;
  }
  this->entryPool_ = pEVar2;
  if (!bVar6) {
    this->operators_ = &colSettings->operators;
  }
  ppEVar1 = (column->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar4 = (column->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar4 != ppEVar1;
      ppEVar4 = ppEVar4 + 1) {
    _update_entry(this,(Field_element *)*ppEVar4,(*ppEVar4)->rowIndex_,(Index)pFVar5);
    pFVar5 = (Field_operators *)(ulong)((Index)pFVar5 + 1);
  }
  return;
}

Assistant:

inline Vector_column<Master_matrix>::Vector_column(const Vector_column& column, Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.size(), nullptr),
      erasedValues_(column.erasedValues_),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::Option_list::has_row_access,
                "Simple copy constructor not available when row access option enabled. Please specify the new column "
                "index and the row container.");

  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  Index i = 0;
  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _update_entry(entry->get_row_index(), i++);
    } else {
      _update_entry(entry->get_element(), entry->get_row_index(), i++);
    }
  }
}